

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Function_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addFuncDecl
          (Result<wasm::Function_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames)

{
  int __val;
  Name root;
  Name name_;
  Name name_00;
  bool bVar1;
  Function *pFVar2;
  pointer pFVar3;
  type item;
  char *__lhs;
  Function *local_140;
  ParseDeclsCtx *local_138;
  size_t sStack_130;
  string_view local_128;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Name local_d8;
  ParseDeclsCtx *local_c8;
  size_t sStack_c0;
  undefined4 local_b0;
  allocator<char> local_a9;
  string local_a8;
  Err local_88;
  ParseDeclsCtx *local_68;
  size_t sStack_60;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_40;
  __single_object f;
  ImportNames *importNames_local;
  Index pos_local;
  ParseDeclsCtx *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)importNames
  ;
  name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  std::make_unique<wasm::Function>();
  bVar1 = IString::is((IString *)&this_local);
  if (bVar1) {
    local_68 = this_local;
    sStack_60 = name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)this_local;
    pFVar2 = Module::getFunctionOrNull(this->wasm,name_00);
    if (pFVar2 != (Function *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"repeated function name",&local_a9);
      Lexer::err(&local_88,&this->in,(ulong)pos,&local_a8);
      Result<wasm::Function_*>::Result(__return_storage_ptr__,&local_88);
      wasm::Err::~Err(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      goto LAB_0230ef9f;
    }
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_40);
    local_c8 = this_local;
    sStack_c0 = name_local.super_IString.str._M_len;
    name_.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_.super_IString.str._M_len = (size_t)this_local;
    Named::setExplicitName((Named *)pFVar3,name_);
  }
  else {
    __lhs = "";
    if ((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
        f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0) {
      __lhs = "fimport$";
    }
    __val = this->funcCounter;
    this->funcCounter = __val + 1;
    std::__cxx11::to_string(&local_118,__val);
    std::operator+(&local_f8,__lhs,&local_118);
    wasm::Name::Name(&local_d8,&local_f8);
    wasm::Name::operator=((Name *)&this_local,&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_138 = this_local;
    sStack_130 = name_local.super_IString.str._M_len;
    root.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    root.super_IString.str._M_len = (size_t)this_local;
    local_128 = (string_view)Names::getValidFunctionName(this->wasm,root);
    wasm::Name::operator=((Name *)&this_local,(Name *)&local_128);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_40);
    wasm::Name::operator=((Name *)pFVar3,(Name *)&this_local);
  }
  item = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator*(&local_40)
  ;
  anon_unknown_5::applyImportNames
            (&item->super_Importable,
             (ImportNames *)
             f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
             .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  local_140 = Module::addFunction(this->wasm,&local_40);
  Result<wasm::Function*>::Result<wasm::Function*>
            ((Result<wasm::Function*> *)__return_storage_ptr__,&local_140);
LAB_0230ef9f:
  local_b0 = 1;
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Result<Function*>
ParseDeclsCtx::addFuncDecl(Index pos, Name name, ImportNames* importNames) {
  auto f = std::make_unique<Function>();
  if (name.is()) {
    if (wasm.getFunctionOrNull(name)) {
      // TDOO: if the existing function is not explicitly named, fix its name
      // and continue.
      return in.err(pos, "repeated function name");
    }
    f->setExplicitName(name);
  } else {
    name = (importNames ? "fimport$" : "") + std::to_string(funcCounter++);
    name = Names::getValidFunctionName(wasm, name);
    f->name = name;
  }
  applyImportNames(*f, importNames);
  return wasm.addFunction(std::move(f));
}